

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall cs_impl::fiber::Routine::Routine(Routine *this,context_t *cxt,function<void_()> *f)

{
  undefined8 uVar1;
  size_t size;
  pointer *__ptr;
  
  this->this_context = (process_context *)cs::current_process;
  cs::process_context::fork((process_context *)&this->cs_pcontext);
  size = 100;
  if (999 < *(ulong *)(cs::current_process + 0x78)) {
    size = *(ulong *)(cs::current_process + 0x78) / 10;
  }
  (this->cs_stack).m_start = (domain_type *)0x0;
  (this->cs_stack).m_current = (domain_type *)0x0;
  (this->cs_stack).m_data = (aligned_type *)0x0;
  (this->cs_stack).m_size = 0;
  cs::stack_type<cs::domain_type,_std::allocator>::resize(&this->cs_stack,size);
  this->cs_context = cxt;
  *(undefined8 *)&(this->func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func).super__Function_base._M_functor + 8) = 0;
  (this->func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func)._M_invoker = f->_M_invoker;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(f->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func).super__Function_base._M_functor =
         *(undefined8 *)&(f->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func).super__Function_base._M_functor + 8) = uVar1;
    (this->func).super__Function_base._M_manager = (f->super__Function_base)._M_manager;
    (f->super__Function_base)._M_manager = (_Manager_type)0x0;
    f->_M_invoker = (_Invoker_type)0x0;
  }
  this->stack = (char *)0x0;
  this->finished = false;
  return;
}

Assistant:

Routine(const cs::context_t &cxt, std::function<void()> f) : cs_pcontext(cs::current_process->fork()), cs_stack(cs::current_process->child_stack_size()), cs_context(cxt), func(std::move(f))
			{
				stack = nullptr;
				finished = false;
			}